

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestObject::~TestObject(TestObject *this)

{
  bool bVar1;
  Fault local_80;
  Fault f;
  undefined1 local_70 [8];
  DebugComparison<int_&,_int_&> _kjCondition_1;
  DebugExpression<int_&> DStack_40;
  bool _kj_shouldLog;
  undefined1 local_38 [8];
  DebugComparison<int_&,_int_&> _kjCondition;
  TestObject *this_local;
  
  if (this->index == -1) {
    kj::(anonymous_namespace)::TestObject::copiedCount =
         kj::(anonymous_namespace)::TestObject::copiedCount + -1;
  }
  else {
    kj::(anonymous_namespace)::TestObject::count = kj::(anonymous_namespace)::TestObject::count + -1
    ;
    _kjCondition._32_8_ = this;
    DStack_40 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->index);
    kj::_::DebugExpression<int&>::operator==
              ((DebugComparison<int_&,_int_&> *)local_38,
               (DebugExpression<int&> *)&stack0xffffffffffffffc0,
               &kj::(anonymous_namespace)::TestObject::count);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
    if (!bVar1) {
      _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_1._39_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int&,int&>&,int&,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                   ,0x30,ERROR,
                   "\"failed: expected \" \"(index) == (count)\", _kjCondition, index, count",
                   (char (*) [36])"failed: expected (index) == (count)",
                   (DebugComparison<int_&,_int_&> *)local_38,&this->index,
                   &kj::(anonymous_namespace)::TestObject::count);
        _kjCondition_1._39_1_ = 0;
      }
    }
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             &kj::(anonymous_namespace)::TestObject::count);
    kj::_::DebugExpression<int&>::operator!=
              ((DebugComparison<int_&,_int_&> *)local_70,(DebugExpression<int&> *)&f,
               &kj::(anonymous_namespace)::TestObject::throwAt);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_70);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int&>&>
                (&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x31,FAILED,"count != throwAt","_kjCondition,",
                 (DebugComparison<int_&,_int_&> *)local_70);
      kj::_::Debug::Fault::fatal(&local_80);
    }
  }
  return;
}

Assistant:

~TestObject() noexcept(false) {
    if (index == -1) {
      --copiedCount;
    } else {
      --count;
      EXPECT_EQ(index, count);
      KJ_ASSERT(count != throwAt);
    }
  }